

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

void * xrealloc(void *ptr,size_t size)

{
  size_t size_local;
  void *ptr_local;
  
  if (size == 0) {
    free(ptr);
    ptr_local = (void *)0x0;
  }
  else {
    ptr_local = realloc(ptr,size);
    if (ptr_local == (void *)0x0) {
      die("not enough memory");
    }
  }
  return ptr_local;
}

Assistant:

static inline void* xrealloc(void* ptr, size_t size) {
    if (size == 0) {
        free(ptr);
        return NULL;
    }
    ptr = realloc(ptr, size);
    if (!ptr)
        die("not enough memory");
    return ptr;
}